

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall duckdb_re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  Inst *pIVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  Compiler *this_00;
  Frag FVar6;
  uint32_t local_1c0;
  uint uStack_1bc;
  uint32_t uStack_1b8;
  uint uStack_1b4;
  Compiler local_1a8;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)root;
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if ((pIVar1[root].out_opcode_ & 7) == 2) {
    bVar2 = ByteRangeEqual(this,root,id);
    this_00 = this;
    if (!bVar2) {
LAB_00ea1a21:
      FVar6 = NoMatch(this_00);
      local_1c0 = FVar6.begin;
      uStack_1bc = FVar6.end.head;
      uStack_1b8 = FVar6.end.tail;
      uStack_1b4 = CONCAT31(uStack_1b4._1_3_,FVar6.nullable);
      goto LAB_00ea1a5e;
    }
    uStack_1bc = 0;
    uStack_1b8 = 0;
    local_1c0 = root;
  }
  else {
    bVar2 = this->reversed_;
    do {
      local_1c0 = (uint32_t)uVar5;
      uVar4 = pIVar1[(int)local_1c0].out_opcode_;
      if ((uVar4 & 7) != 0) {
        this_00 = &local_1a8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"should never happen");
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        goto LAB_00ea1a21;
      }
      this_00 = this;
      bVar3 = ByteRangeEqual(this,pIVar1[(int)local_1c0].field_1.cap_,id);
      if (bVar3) {
        uStack_1bc = local_1c0 * 2 + 1;
        goto LAB_00ea1a41;
      }
      if ((bVar2 & 1U) == 0) goto LAB_00ea1a21;
      uVar4 = uVar4 >> 4;
      uVar5 = (ulong)uVar4;
    } while ((pIVar1[uVar5].out_opcode_ & 7) == 0);
    bVar2 = ByteRangeEqual(this,uVar4,id);
    this_00 = this;
    if (!bVar2) goto LAB_00ea1a21;
    uStack_1bc = local_1c0 * 2;
LAB_00ea1a41:
    uStack_1b8 = uStack_1bc / 1;
  }
  uStack_1b4 = uStack_1b4 & 0xffffff00;
LAB_00ea1a5e:
  FVar6.end.head = uStack_1bc;
  FVar6.begin = local_1c0;
  FVar6.end.tail = uStack_1b8;
  FVar6._12_4_ = uStack_1b4;
  return FVar6;
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, kNullPatchList, false);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1), false);

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1), false);
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}